

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O0

void __thiscall vm::VM::T2T<int,unsigned_char>(VM *this)

{
  int_t iVar1;
  VM *this_local;
  
  iVar1 = POP<int>(this);
  PUSH<unsigned_char>(this,(char_t)iVar1);
  return;
}

Assistant:

void VM::T2T() {
    // static_assert(std::is_arithmetic_v<T1> && std::is_arithmetic_v<T2>);
    static_assert(!std::is_same_v<T1, T2>);
    PUSH(static_cast<T2>(POP<T1>()));
}